

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O0

EStatusCode __thiscall
Type1ToType2Converter::RecordOperatorWithParameters
          (Type1ToType2Converter *this,unsigned_short inMarkerType,LongList *inOperandList)

{
  size_t __x;
  reference pvVar1;
  undefined1 local_40 [8];
  ConversionNode node;
  LongList *inOperandList_local;
  unsigned_short inMarkerType_local;
  Type1ToType2Converter *this_local;
  
  node.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size =
       (size_t)inOperandList;
  ConversionNode::ConversionNode((ConversionNode *)local_40);
  std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::push_back
            (&this->mConversionProgram,(ConversionNode *)local_40);
  pvVar1 = std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::back
                     (&this->mConversionProgram);
  __x = node.mOperands.super__List_base<long,_std::allocator<long>_>._M_impl._M_node._M_size;
  pvVar1->mMarkerType = inMarkerType;
  pvVar1 = std::__cxx11::list<ConversionNode,_std::allocator<ConversionNode>_>::back
                     (&this->mConversionProgram);
  std::__cxx11::list<long,_std::allocator<long>_>::operator=
            (&pvVar1->mOperands,(list<long,_std::allocator<long>_> *)__x);
  ConversionNode::~ConversionNode((ConversionNode *)local_40);
  return eSuccess;
}

Assistant:

EStatusCode Type1ToType2Converter::RecordOperatorWithParameters(unsigned short inMarkerType,const LongList& inOperandList)
{
	ConversionNode node;
	mConversionProgram.push_back(node);
	mConversionProgram.back().mMarkerType = inMarkerType;
	mConversionProgram.back().mOperands = inOperandList;
	return eSuccess;
}